

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O0

void play_floatbuffer(snd_pcm_t *device,snd_pcm_format_t format,size_t period_size,float preamp,
                     float *buffer,void *alsabuffer)

{
  FILE *pFVar1;
  int iVar2;
  undefined8 uVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_R8;
  float in_XMM0_Da;
  int ret_1;
  size_t i_2;
  size_t i_1;
  size_t i;
  uint channels;
  int ret;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  if (((in_ESI != 0xe) || (in_XMM0_Da != 1.0)) || (NAN(in_XMM0_Da))) {
    if (in_ESI == 2) {
      for (local_40 = 0; local_40 < (ulong)(in_RDX << 1); local_40 = local_40 + 1) {
        if (*(float *)(in_RCX + local_40 * 4) * in_XMM0_Da <= 1.0) {
          if (-1.0 <= *(float *)(in_RCX + local_40 * 4) * in_XMM0_Da) {
            local_70 = (double)*(float *)(in_RCX + local_40 * 4) * (double)in_XMM0_Da;
          }
          else {
            local_70 = -1.0;
          }
          local_68 = local_70;
        }
        else {
          local_68 = 1.0;
        }
        *(short *)(in_R8 + local_40 * 2) = (short)(int)(local_68 * 32767.0);
      }
    }
    else if (in_ESI == 10) {
      for (local_48 = 0; local_48 < (ulong)(in_RDX << 1); local_48 = local_48 + 1) {
        if (*(float *)(in_RCX + local_48 * 4) * in_XMM0_Da <= 1.0) {
          if (-1.0 <= *(float *)(in_RCX + local_48 * 4) * in_XMM0_Da) {
            local_80 = (double)*(float *)(in_RCX + local_48 * 4) * (double)in_XMM0_Da;
          }
          else {
            local_80 = -1.0;
          }
          local_78 = local_80;
        }
        else {
          local_78 = 1.0;
        }
        *(int *)(in_R8 + local_48 * 4) = (int)(local_78 * 2147483647.0);
      }
    }
    else if (in_ESI == 0xe) {
      for (local_50 = 0; local_50 < (ulong)(in_RDX << 1); local_50 = local_50 + 1) {
        *(float *)(in_R8 + local_50 * 4) = *(float *)(in_RCX + local_50 * 4) * in_XMM0_Da;
      }
    }
    iVar2 = snd_pcm_writei(in_RDI,in_R8,in_RDX);
    if ((iVar2 < 0) && (iVar2 = snd_pcm_recover(in_RDI,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
      uVar3 = snd_strerror(iVar2);
      fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
              ,0xc1,uVar3);
      fflush(_stderr);
      exit(1);
    }
  }
  else {
    iVar2 = snd_pcm_writei(in_RDI,in_RCX,in_RDX);
    if ((iVar2 < 0) && (iVar2 = snd_pcm_recover(in_RDI,iVar2,0), pFVar1 = _stderr, iVar2 < 0)) {
      uVar3 = snd_strerror(iVar2);
      fprintf(pFVar1,"%s(%i) ALSA internal error : %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/alsa_common.h"
              ,0xaf,uVar3);
      fflush(_stderr);
      exit(1);
    }
  }
  return;
}

Assistant:

void play_floatbuffer(snd_pcm_t* device, snd_pcm_format_t format, size_t period_size, float preamp,
                   float* buffer, void* alsabuffer) {
	if(format == SND_PCM_FORMAT_FLOAT && preamp == 1.f) {
		CHECK_ALSA_CALL(snd_pcm_writei(device, buffer, period_size));
	} else {
		const unsigned int channels = 2;

		if(format == SND_PCM_FORMAT_S16) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int16_t*)alsabuffer)[i] = (int16_t)(CLAMP((double)buffer[i] * preamp) * 32767.);
			}
		} else if(format == SND_PCM_FORMAT_S32) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int32_t*)alsabuffer)[i] = (int32_t)(CLAMP((double)buffer[i] * preamp) * 2147483647.);
			}
		} else if(format == SND_PCM_FORMAT_FLOAT) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((float*)alsabuffer)[i] = buffer[i] * preamp;
			}
		}

		CHECK_ALSA_CALL(snd_pcm_writei(device, alsabuffer, period_size));
	}
}